

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O0

void blend_a64_vmask_w8_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  uint in_ECX;
  __m128i *in_RDX;
  uint in_ESI;
  long lVar1;
  uint8_t *in_RDI;
  long in_R8;
  uint in_R9D;
  __m128i alVar2;
  __m128i v_res_b;
  __m128i v_res_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  __m128i v_maxval_w;
  long local_b8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  
  local_b8 = in_R8;
  do {
    lVar1 = local_b8;
    alVar2 = blend_8(in_RDI,(uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffff60),in_RDX,
                     (__m128i *)CONCAT44(in_ECX,in_stack_ffffffffffffff50));
    alVar2[0] = lVar1;
    xx_storel_64(in_RDI,alVar2);
    in_RDI = in_RDI + in_ESI;
    in_RDX = (__m128i *)((long)*in_RDX + (ulong)in_ECX);
    local_b8 = local_b8 + (ulong)in_R9D;
    v_res_b[1]._0_4_ = (int)v_res_b[1] + -1;
  } while ((int)v_res_b[1] != 0);
  return;
}

Assistant:

static void blend_a64_vmask_w8_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                      const uint8_t *src0, uint32_t src0_stride,
                                      const uint8_t *src1, uint32_t src1_stride,
                                      const uint8_t *mask, int w, int h) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  (void)w;

  do {
    const __m128i v_m0_w = _mm_set1_epi16(*mask);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

    const __m128i v_res_w = blend_8(src0, src1, &v_m0_w, &v_m1_w);

    const __m128i v_res_b = _mm_packus_epi16(v_res_w, v_res_w);

    xx_storel_64(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 1;
  } while (--h);
}